

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# convolve.c
# Opt level: O1

void av1_convolve_2d_sr_c
               (uint8_t *src,int src_stride,uint8_t *dst,int dst_stride,int w,int h,
               InterpFilterParams *filter_params_x,InterpFilterParams *filter_params_y,
               int subpel_x_qn,int subpel_y_qn,ConvolveParams *conv_params)

{
  ushort uVar1;
  ushort uVar2;
  int16_t *piVar3;
  uint8_t uVar4;
  uint uVar5;
  ulong uVar6;
  byte bVar7;
  byte bVar8;
  byte bVar9;
  byte bVar10;
  int iVar11;
  long lVar12;
  ulong uVar13;
  short *psVar14;
  int iVar15;
  int iVar16;
  short *psVar17;
  int local_8b94;
  ulong local_8b90;
  short *local_8b80;
  uint local_8b58;
  short asStack_8b38 [17796];
  
  uVar1 = filter_params_y->taps;
  uVar5 = (h + (uint)uVar1) - 1;
  iVar11 = (uVar1 >> 1) - 1;
  lVar12 = (long)w;
  bVar7 = (byte)conv_params->round_0;
  if (0 < (int)uVar5) {
    uVar2 = filter_params_x->taps;
    piVar3 = filter_params_x->filter_ptr;
    local_8b94 = 1 - (uint)(uVar2 >> 1);
    local_8b90 = 0;
    do {
      if (0 < w) {
        uVar6 = 0;
        iVar15 = local_8b94;
        do {
          if (uVar2 == 0) {
            iVar16 = 0x4000;
          }
          else {
            iVar16 = 0x4000;
            uVar13 = 0;
            do {
              iVar16 = iVar16 + (uint)src[uVar13 + ((long)iVar15 - (long)(iVar11 * src_stride))] *
                                (int)*(short *)((long)piVar3 +
                                               uVar13 * 2 +
                                               (ulong)((subpel_x_qn & 0xfU) * (uint)uVar2 * 2));
              uVar13 = uVar13 + 1;
            } while ((uint)uVar2 != uVar13);
          }
          asStack_8b38[uVar6 + local_8b90 * lVar12] =
               (short)(iVar16 + ((1 << (bVar7 & 0x1f)) >> 1) >> (bVar7 & 0x1f));
          uVar6 = uVar6 + 1;
          iVar15 = iVar15 + 1;
        } while (uVar6 != (uint)w);
      }
      local_8b90 = local_8b90 + 1;
      local_8b94 = local_8b94 + src_stride;
    } while (local_8b90 != uVar5);
  }
  local_8b58 = (uint)uVar1;
  if (0 < h) {
    bVar8 = 0xe - ((char)conv_params->round_1 + bVar7);
    piVar3 = filter_params_y->filter_ptr;
    iVar15 = 1 << (0x16 - bVar7 & 0x1f);
    local_8b80 = asStack_8b38 + (1 - (ulong)(uint)(uVar1 >> 1)) * lVar12 + (long)(iVar11 * w);
    local_8b90 = 0;
    do {
      if (0 < w) {
        uVar6 = 0;
        psVar14 = local_8b80;
        do {
          iVar11 = iVar15;
          if ((ulong)filter_params_y->taps != 0) {
            uVar13 = 0;
            psVar17 = psVar14;
            do {
              iVar11 = iVar11 + (int)*psVar17 *
                                (int)*(short *)((long)piVar3 +
                                               uVar13 * 2 +
                                               (ulong)((subpel_y_qn & 0xfU) * local_8b58 * 2));
              uVar13 = uVar13 + 1;
              psVar17 = psVar17 + lVar12;
            } while (filter_params_y->taps != uVar13);
          }
          bVar9 = (byte)conv_params->round_1;
          bVar10 = (0x16 - bVar7) - bVar9;
          iVar11 = (int)(short)((short)(-1 << (bVar10 - 1 & 0x1f)) + (short)(-1 << (bVar10 & 0x1f))
                               + (short)(((1 << (bVar9 & 0x1f)) >> 1) + iVar11 >> (bVar9 & 0x1f))) +
                   ((1 << (bVar8 & 0x1f)) >> 1) >> (bVar8 & 0x1f);
          if (iVar11 < 1) {
            iVar11 = 0;
          }
          uVar4 = (uint8_t)iVar11;
          if (0xfe < iVar11) {
            uVar4 = 0xff;
          }
          dst[uVar6 + local_8b90 * (long)dst_stride] = uVar4;
          uVar6 = uVar6 + 1;
          psVar14 = psVar14 + 1;
        } while (uVar6 != (uint)w);
      }
      local_8b90 = local_8b90 + 1;
      local_8b80 = local_8b80 + lVar12;
    } while (local_8b90 != (uint)h);
  }
  return;
}

Assistant:

void av1_convolve_2d_sr_c(const uint8_t *src, int src_stride, uint8_t *dst,
                          int dst_stride, int w, int h,
                          const InterpFilterParams *filter_params_x,
                          const InterpFilterParams *filter_params_y,
                          const int subpel_x_qn, const int subpel_y_qn,
                          ConvolveParams *conv_params) {
  int16_t im_block[(MAX_SB_SIZE + MAX_FILTER_TAP - 1) * MAX_SB_SIZE];
  int im_h = h + filter_params_y->taps - 1;
  int im_stride = w;
  assert(w <= MAX_SB_SIZE && h <= MAX_SB_SIZE);
  const int fo_vert = filter_params_y->taps / 2 - 1;
  const int fo_horiz = filter_params_x->taps / 2 - 1;
  const int bd = 8;
  const int bits =
      FILTER_BITS * 2 - conv_params->round_0 - conv_params->round_1;

  // horizontal filter
  const uint8_t *src_horiz = src - fo_vert * src_stride;
  const int16_t *x_filter = av1_get_interp_filter_subpel_kernel(
      filter_params_x, subpel_x_qn & SUBPEL_MASK);
  for (int y = 0; y < im_h; ++y) {
    for (int x = 0; x < w; ++x) {
      int32_t sum = (1 << (bd + FILTER_BITS - 1));
      for (int k = 0; k < filter_params_x->taps; ++k) {
        sum += x_filter[k] * src_horiz[y * src_stride + x - fo_horiz + k];
      }

      // TODO(aomedia:3393): for 12-tap filter, in extreme cases, the result can
      // be beyond the following range. For better prediction, a clamping can be
      // added for 12 tap filter to ensure the horizontal filtering result is
      // within 16 bit. The same applies to the vertical filtering.
      assert(filter_params_x->taps > 8 ||
             (0 <= sum && sum < (1 << (bd + FILTER_BITS + 1))));
      im_block[y * im_stride + x] =
          (int16_t)ROUND_POWER_OF_TWO(sum, conv_params->round_0);
    }
  }

  // vertical filter
  int16_t *src_vert = im_block + fo_vert * im_stride;
  const int16_t *y_filter = av1_get_interp_filter_subpel_kernel(
      filter_params_y, subpel_y_qn & SUBPEL_MASK);
  const int offset_bits = bd + 2 * FILTER_BITS - conv_params->round_0;
  for (int y = 0; y < h; ++y) {
    for (int x = 0; x < w; ++x) {
      int32_t sum = 1 << offset_bits;
      for (int k = 0; k < filter_params_y->taps; ++k) {
        sum += y_filter[k] * src_vert[(y - fo_vert + k) * im_stride + x];
      }
      assert(filter_params_y->taps > 8 ||
             (0 <= sum && sum < (1 << (offset_bits + 2))));
      int16_t res = ROUND_POWER_OF_TWO(sum, conv_params->round_1) -
                    ((1 << (offset_bits - conv_params->round_1)) +
                     (1 << (offset_bits - conv_params->round_1 - 1)));
      dst[y * dst_stride + x] = clip_pixel(ROUND_POWER_OF_TWO(res, bits));
    }
  }
}